

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandReporter.cpp
# Opt level: O1

void __thiscall
ApprovalTests::CommandReporter::CommandReporter
          (CommandReporter *this,string *command,CommandLauncher *launcher)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  bool useCygwin;
  
  (this->super_Reporter)._vptr_Reporter = (_func_int **)&PTR__CommandReporter_001a39d8;
  paVar1 = &(this->cmd).field_2;
  (this->cmd)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (command->_M_dataplus)._M_p;
  paVar2 = &command->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&command->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->cmd).field_2 + 8) = uVar4;
  }
  else {
    (this->cmd)._M_dataplus._M_p = pcVar3;
    (this->cmd).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->cmd)._M_string_length = command->_M_string_length;
  (command->_M_dataplus)._M_p = (pointer)paVar2;
  command->_M_string_length = 0;
  (command->field_2)._M_local_buf[0] = '\0';
  DiffInfo::getDefaultArguments_abi_cxx11_();
  this->l = launcher;
  (this->converter).super___shared_ptr<ApprovalTests::ConvertForCygwin,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->converter).super___shared_ptr<ApprovalTests::ConvertForCygwin,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  useCygwin = SystemUtils::isCygwin();
  useCygwinConversions(this,useCygwin);
  return;
}

Assistant:

CommandReporter::CommandReporter(std::string command, CommandLauncher* launcher)
        : cmd(std::move(command)), l(launcher)
    {
        checkForCygwin();
    }